

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::~ArrayBuilder
          (ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this)

{
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar1;
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar2;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar3;
  
  pMVar1 = this->ptr;
  if (pMVar1 != (Maybe<kj::Own<capnp::ClientHook>_> *)0x0) {
    pRVar2 = this->pos;
    pMVar3 = this->endPtr;
    this->ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    this->pos = (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
    this->endPtr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pMVar1,0x10,(long)pRVar2 - (long)pMVar1 >> 4,
               (long)pMVar3 - (long)pMVar1 >> 4,
               ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }